

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_json.c
# Opt level: O0

LY_ERR lyd_parse_json(ly_ctx *ctx,lysc_ext_instance *ext,lyd_node *parent,lyd_node **first_p,
                     ly_in *in,uint32_t parse_opts,uint32_t val_opts,uint32_t int_opts,
                     ly_set *parsed,ly_bool *subtree_sibling,lyd_ctx **lydctx_p)

{
  lyd_json_ctx *lydctx_00;
  LY_ERR LVar1;
  LYJSON_PARSER_STATUS LVar2;
  ly_err_item *plVar3;
  ly_in *local_78;
  ly_err_item *__eitem_2;
  ly_err_item *__eitem_1;
  ly_err_item *__eitem;
  lyd_json_ctx *plStack_48;
  LYJSON_PARSER_STATUS status;
  lyd_json_ctx *lydctx;
  LY_ERR local_38;
  LY_ERR rc;
  LY_ERR r;
  uint32_t parse_opts_local;
  ly_in *in_local;
  lyd_node **first_p_local;
  lyd_node *parent_local;
  lysc_ext_instance *ext_local;
  ly_ctx *ctx_local;
  
  lydctx._4_4_ = 0;
  plStack_48 = (lyd_json_ctx *)0x0;
  rc = parse_opts;
  _r = in;
  in_local = (ly_in *)first_p;
  first_p_local = (lyd_node **)parent;
  parent_local = (lyd_node *)ext;
  ext_local = (lysc_ext_instance *)ctx;
  lydctx._4_4_ = lyd_parse_json_init(ctx,in,parse_opts,val_opts,&stack0xffffffffffffffb8);
  LVar1 = lydctx._4_4_;
  if (lydctx._4_4_ == LY_SUCCESS) {
    plStack_48->int_opts = int_opts;
    plStack_48->ext = (lysc_ext_instance *)parent_local;
    lydctx._4_4_ = lyd_parser_find_operation
                             ((lyd_node *)first_p_local,int_opts,&plStack_48->op_node);
    LVar1 = lydctx._4_4_;
    if (lydctx._4_4_ == LY_SUCCESS) {
      do {
        local_38 = lydjson_subtree_r(plStack_48,(lyd_node *)first_p_local,(lyd_node **)in_local,
                                     parsed);
        if ((local_38 != LY_SUCCESS) &&
           ((((lydctx._4_4_ = local_38, plVar3 = ly_err_last(plStack_48->jsonctx->ctx),
              LVar1 = lydctx._4_4_, local_38 != LY_EVALID || (plStack_48 == (lyd_json_ctx *)0x0)) ||
             ((plStack_48->val_opts & 4) == 0)) || (plVar3->vecode == LYVE_SYNTAX))))
        goto LAB_0014ced6;
        LVar2 = lyjson_ctx_status(plStack_48->jsonctx);
      } while (((int_opts & 0x20) != 0) && (LVar2 == LYJSON_OBJECT_NEXT));
      if (((int_opts & 0x40) != 0) &&
         ((*plStack_48->jsonctx->in->current != '\0' && (LVar2 != LYJSON_OBJECT_CLOSED)))) {
        ly_vlog((ly_ctx *)ext_local,(char *)0x0,LYVE_SYNTAX,"Unexpected sibling node.");
        local_38 = LY_EVALID;
        lydctx._4_4_ = LY_EVALID;
        plVar3 = ly_err_last(plStack_48->jsonctx->ctx);
        LVar1 = lydctx._4_4_;
        if ((local_38 != LY_EVALID) ||
           (((plStack_48 == (lyd_json_ctx *)0x0 || ((plStack_48->val_opts & 4) == 0)) ||
            (plVar3->vecode == LYVE_SYNTAX)))) goto LAB_0014ced6;
      }
      if (((int_opts & 0xf) != 0) && (plStack_48->op_node == (lyd_node *)0x0)) {
        ly_vlog((ly_ctx *)ext_local,(char *)0x0,LYVE_DATA,"Missing the operation node.");
        local_38 = LY_EVALID;
        lydctx._4_4_ = LY_EVALID;
        plVar3 = ly_err_last(plStack_48->jsonctx->ctx);
        LVar1 = lydctx._4_4_;
        if (((local_38 != LY_EVALID) ||
            ((plStack_48 == (lyd_json_ctx *)0x0 || ((plStack_48->val_opts & 4) == 0)))) ||
           (plVar3->vecode == LYVE_SYNTAX)) goto LAB_0014ced6;
      }
      lydctx_00 = plStack_48;
      if (first_p_local == (lyd_node **)0x0) {
        local_78 = in_local;
      }
      else {
        local_78 = (ly_in *)lyd_node_child_p((lyd_node *)first_p_local);
      }
      local_38 = lydjson_metadata_finish(lydctx_00,(lyd_node **)local_78);
      LVar1 = local_38;
      if ((local_38 == LY_SUCCESS) && (LVar1 = lydctx._4_4_, (rc & 0x400000) != LY_SUCCESS)) {
        if (subtree_sibling == (ly_bool *)0x0) {
          __assert_fail("subtree_sibling",
                        "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/parser_json.c"
                        ,0x773,
                        "LY_ERR lyd_parse_json(const struct ly_ctx *, const struct lysc_ext_instance *, struct lyd_node *, struct lyd_node **, struct ly_in *, uint32_t, uint32_t, uint32_t, struct ly_set *, ly_bool *, struct lyd_ctx **)"
                       );
        }
        if (LVar2 == LYJSON_OBJECT_NEXT) {
          *subtree_sibling = '\x01';
          ly_in_skip(plStack_48->jsonctx->in,1);
          LVar1 = lydctx._4_4_;
        }
        else {
          *subtree_sibling = '\0';
        }
      }
    }
  }
LAB_0014ced6:
  lydctx._4_4_ = LVar1;
  if ((((rc & 0x10000) != LY_SUCCESS) && (plStack_48 != (lyd_json_ctx *)0x0)) &&
     (((plStack_48->node_types).count != 0 ||
      (((plStack_48->meta_types).count != 0 || ((plStack_48->node_when).count != 0)))))) {
    __assert_fail("!(parse_opts & LYD_PARSE_ONLY) || !lydctx || (!lydctx->node_types.count && !lydctx->meta_types.count && !lydctx->node_when.count)"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/parser_json.c"
                  ,0x781,
                  "LY_ERR lyd_parse_json(const struct ly_ctx *, const struct lysc_ext_instance *, struct lyd_node *, struct lyd_node **, struct ly_in *, uint32_t, uint32_t, uint32_t, struct ly_set *, ly_bool *, struct lyd_ctx **)"
                 );
  }
  if ((lydctx._4_4_ == LY_SUCCESS) ||
     (((plStack_48 != (lyd_json_ctx *)0x0 && ((plStack_48->val_opts & 4) != 0)) &&
      (lydctx._4_4_ == LY_EVALID)))) {
    *lydctx_p = (lyd_ctx *)plStack_48;
    lyjson_ctx_free(plStack_48->jsonctx);
    plStack_48->jsonctx = (lyjson_ctx *)0x0;
  }
  else {
    lyd_json_ctx_free((lyd_ctx *)plStack_48);
  }
  return lydctx._4_4_;
}

Assistant:

LY_ERR
lyd_parse_json(const struct ly_ctx *ctx, const struct lysc_ext_instance *ext, struct lyd_node *parent,
        struct lyd_node **first_p, struct ly_in *in, uint32_t parse_opts, uint32_t val_opts, uint32_t int_opts,
        struct ly_set *parsed, ly_bool *subtree_sibling, struct lyd_ctx **lydctx_p)
{
    LY_ERR r, rc = LY_SUCCESS;
    struct lyd_json_ctx *lydctx = NULL;
    enum LYJSON_PARSER_STATUS status;

    rc = lyd_parse_json_init(ctx, in, parse_opts, val_opts, &lydctx);
    LY_CHECK_GOTO(rc, cleanup);

    lydctx->int_opts = int_opts;
    lydctx->ext = ext;

    /* find the operation node if it exists already */
    LY_CHECK_GOTO(rc = lyd_parser_find_operation(parent, int_opts, &lydctx->op_node), cleanup);

    /* read subtree(s) */
    do {
        r = lydjson_subtree_r(lydctx, parent, first_p, parsed);
        LY_DPARSER_ERR_GOTO(r, rc = r, lydctx, cleanup);

        status = lyjson_ctx_status(lydctx->jsonctx);

        if (!(int_opts & LYD_INTOPT_WITH_SIBLINGS)) {
            break;
        }
    } while (status == LYJSON_OBJECT_NEXT);

    if ((int_opts & LYD_INTOPT_NO_SIBLINGS) && lydctx->jsonctx->in->current[0] && (status != LYJSON_OBJECT_CLOSED)) {
        LOGVAL(ctx, LYVE_SYNTAX, "Unexpected sibling node.");
        r = LY_EVALID;
        LY_DPARSER_ERR_GOTO(r, rc = r, lydctx, cleanup);
    }
    if ((int_opts & (LYD_INTOPT_RPC | LYD_INTOPT_ACTION | LYD_INTOPT_NOTIF | LYD_INTOPT_REPLY)) && !lydctx->op_node) {
        LOGVAL(ctx, LYVE_DATA, "Missing the operation node.");
        r = LY_EVALID;
        LY_DPARSER_ERR_GOTO(r, rc = r, lydctx, cleanup);
    }

    /* finish linking metadata */
    r = lydjson_metadata_finish(lydctx, parent ? lyd_node_child_p(parent) : first_p);
    LY_CHECK_ERR_GOTO(r, rc = r, cleanup);

    if (parse_opts & LYD_PARSE_SUBTREE) {
        /* check for a sibling object */
        assert(subtree_sibling);
        if (status == LYJSON_OBJECT_NEXT) {
            *subtree_sibling = 1;

            /* move to the next object */
            ly_in_skip(lydctx->jsonctx->in, 1);
        } else {
            *subtree_sibling = 0;
        }
    }

cleanup:
    /* there should be no unresolved types stored */
    assert(!(parse_opts & LYD_PARSE_ONLY) || !lydctx || (!lydctx->node_types.count && !lydctx->meta_types.count &&
            !lydctx->node_when.count));

    if (rc && (!lydctx || !(lydctx->val_opts & LYD_VALIDATE_MULTI_ERROR) || (rc != LY_EVALID))) {
        lyd_json_ctx_free((struct lyd_ctx *)lydctx);
    } else {
        *lydctx_p = (struct lyd_ctx *)lydctx;

        /* the JSON context is no more needed, freeing it also stops logging line numbers which would be confusing now */
        lyjson_ctx_free(lydctx->jsonctx);
        lydctx->jsonctx = NULL;
    }
    return rc;
}